

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_simd.cpp
# Opt level: O0

void compute_padded_integral_img_faster_alg(float *gray_image,integral_image *iimage)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  undefined4 *puVar14;
  undefined8 *puVar15;
  int *in_RSI;
  long in_RDI;
  int i_5;
  int j_6;
  __m256 max_value_vec;
  float max_value_float;
  int index_last_element;
  __m256 prev_elements_in_row;
  int i_4;
  int j_5;
  int i_3;
  __m256 last_element_in_row_vec;
  float last_element_in_row_float;
  int j_4;
  int j_3;
  int j_2;
  int i_2;
  float *iimage_data;
  int height_limit;
  int width_limit;
  int width_1;
  int data_width_1;
  float sum1;
  float sum;
  int i_1;
  int j_1;
  int i;
  int j;
  __m256 zeros_float;
  int border;
  int height;
  int width;
  int data_height;
  int data_width;
  float *iimage_padded_data;
  int local_388;
  int local_384;
  int local_30c;
  int local_308;
  int local_304;
  int local_2c0;
  int local_2bc;
  int local_2b8;
  int local_2b4;
  float local_298;
  float local_294;
  int local_290;
  int local_28c;
  int local_288;
  int local_284;
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined4 local_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  lVar8 = *(long *)(in_RSI + 6);
  iVar2 = in_RSI[4];
  iVar3 = in_RSI[5];
  iVar4 = *in_RSI;
  local_384 = in_RSI[1];
  iVar12 = (iVar2 - iVar4) / 2;
  for (local_284 = 0; local_28c = iVar12, local_284 < iVar12; local_284 = local_284 + 1) {
    for (local_288 = 0; local_288 < iVar2 + -7; local_288 = local_288 + 8) {
      puVar14 = (undefined4 *)(lVar8 + (long)(local_284 * iVar2) * 4 + (long)local_288 * 4);
      *puVar14 = 0;
      puVar14[1] = 0;
      puVar14[2] = 0;
      puVar14[3] = 0;
      puVar14[4] = 0;
      puVar14[5] = 0;
      puVar14[6] = 0;
      puVar14[7] = 0;
    }
    for (; local_288 < iVar2; local_288 = local_288 + 1) {
      *(undefined4 *)(lVar8 + (long)(local_284 * iVar2 + local_288) * 4) = 0;
    }
  }
  for (; local_28c < iVar3; local_28c = local_28c + 1) {
    for (local_290 = 0; local_290 < iVar12 + -7; local_290 = local_290 + 8) {
      puVar14 = (undefined4 *)(lVar8 + (long)(local_28c * iVar2) * 4 + (long)local_290 * 4);
      *puVar14 = 0;
      puVar14[1] = 0;
      puVar14[2] = 0;
      puVar14[3] = 0;
      puVar14[4] = 0;
      puVar14[5] = 0;
      puVar14[6] = 0;
      puVar14[7] = 0;
    }
    for (; local_290 < iVar12; local_290 = local_290 + 1) {
      *(undefined4 *)(lVar8 + (long)(local_28c * iVar2 + local_290) * 4) = 0;
    }
  }
  local_294 = 0.0;
  local_298 = 0.0;
  iVar5 = in_RSI[4];
  iVar6 = *in_RSI;
  iVar13 = iVar6 + -2;
  iVar7 = in_RSI[1];
  lVar9 = *(long *)(in_RSI + 2);
  for (local_2b4 = 0; local_2b4 < iVar13; local_2b4 = local_2b4 + 2) {
    local_294 = *(float *)(in_RDI + (long)local_2b4 * 4) + local_294;
    *(float *)(lVar9 + (long)local_2b4 * 4) = local_294;
    local_294 = *(float *)(in_RDI + (long)(local_2b4 + 1) * 4) + local_294;
    *(float *)(lVar9 + (long)(local_2b4 + 1) * 4) = local_294;
    local_298 = *(float *)(in_RDI + (long)(iVar6 + local_2b4) * 4) + local_298;
    *(float *)(lVar9 + (long)(iVar5 + local_2b4) * 4) =
         *(float *)(lVar9 + (long)local_2b4 * 4) + local_298;
    local_298 = *(float *)(in_RDI + (long)(iVar6 + local_2b4 + 1) * 4) + local_298;
    *(float *)(lVar9 + (long)(iVar5 + local_2b4 + 1) * 4) =
         *(float *)(lVar9 + (long)(local_2b4 + 1) * 4) + local_298;
  }
  for (; local_2b4 < iVar6; local_2b4 = local_2b4 + 1) {
    local_294 = *(float *)(in_RDI + (long)local_2b4 * 4) + local_294;
    *(float *)(lVar9 + (long)local_2b4 * 4) = local_294;
    local_298 = *(float *)(in_RDI + (long)(iVar6 + local_2b4) * 4) + local_298;
    *(float *)(lVar9 + (long)(iVar5 + local_2b4) * 4) =
         *(float *)(lVar9 + (long)local_2b4 * 4) + local_298;
  }
  for (local_2b4 = 2; local_2b4 < iVar7 + -2; local_2b4 = local_2b4 + 2) {
    local_294 = 0.0;
    local_298 = 0.0;
    for (local_2b8 = 0; local_2b8 < iVar13; local_2b8 = local_2b8 + 2) {
      local_294 = *(float *)(in_RDI + (long)(local_2b4 * iVar6 + local_2b8) * 4) + local_294;
      *(float *)(lVar9 + (long)(local_2b4 * iVar5 + local_2b8) * 4) =
           *(float *)(lVar9 + (long)((local_2b4 + -1) * iVar5 + local_2b8) * 4) + local_294;
      local_294 = *(float *)(in_RDI + (long)(local_2b4 * iVar6 + local_2b8 + 1) * 4) + local_294;
      *(float *)(lVar9 + (long)(local_2b4 * iVar5 + local_2b8 + 1) * 4) =
           *(float *)(lVar9 + (long)((local_2b4 + -1) * iVar5 + local_2b8 + 1) * 4) + local_294;
      local_298 = *(float *)(in_RDI + (long)((local_2b4 + 1) * iVar6 + local_2b8) * 4) + local_298;
      *(float *)(lVar9 + (long)((local_2b4 + 1) * iVar5 + local_2b8) * 4) =
           *(float *)(lVar9 + (long)(local_2b4 * iVar5 + local_2b8) * 4) + local_298;
      local_298 = *(float *)(in_RDI + (long)((local_2b4 + 1) * iVar6 + local_2b8 + 1) * 4) +
                  local_298;
      *(float *)(lVar9 + (long)((local_2b4 + 1) * iVar5 + local_2b8 + 1) * 4) =
           *(float *)(lVar9 + (long)(local_2b4 * iVar5 + local_2b8 + 1) * 4) + local_298;
    }
    for (; local_2b8 < iVar6; local_2b8 = local_2b8 + 1) {
      local_294 = *(float *)(in_RDI + (long)(local_2b4 * iVar6 + local_2b8) * 4) + local_294;
      *(float *)(lVar9 + (long)(local_2b4 * iVar5 + local_2b8) * 4) =
           *(float *)(lVar9 + (long)((local_2b4 + -1) * iVar5 + local_2b8) * 4) + local_294;
      local_298 = *(float *)(in_RDI + (long)((local_2b4 + 1) * iVar6 + local_2b8) * 4) + local_298;
      *(float *)(lVar9 + (long)((local_2b4 + 1) * iVar5 + local_2b8) * 4) =
           *(float *)(lVar9 + (long)(local_2b4 * iVar5 + local_2b8) * 4) + local_298;
    }
  }
  for (; local_2c0 = iVar12, local_2b4 < in_RSI[1]; local_2b4 = local_2b4 + 1) {
    local_294 = 0.0;
    for (local_2bc = 0; local_2bc < iVar13; local_2bc = local_2bc + 2) {
      local_294 = *(float *)(in_RDI + (long)(local_2b4 * iVar6 + local_2bc) * 4) + local_294;
      *(float *)(lVar9 + (long)(local_2b4 * iVar5 + local_2bc) * 4) =
           *(float *)(lVar9 + (long)((local_2b4 + -1) * iVar5 + local_2bc) * 4) + local_294;
      local_294 = *(float *)(in_RDI + (long)(local_2b4 * iVar6 + local_2bc + 1) * 4) + local_294;
      *(float *)(lVar9 + (long)(local_2b4 * iVar5 + local_2bc + 1) * 4) =
           *(float *)(lVar9 + (long)((local_2b4 + -1) * iVar5 + local_2bc + 1) * 4) + local_294;
    }
    for (; local_2bc < iVar6; local_2bc = local_2bc + 1) {
      local_294 = *(float *)(in_RDI + (long)(local_2b4 * iVar6 + local_2bc) * 4) + local_294;
      *(float *)(lVar9 + (long)(local_2b4 * iVar5 + local_2bc) * 4) =
           *(float *)(lVar9 + (long)((local_2b4 + -1) * iVar5 + local_2bc) * 4) + local_294;
    }
  }
  for (; local_2c0 < iVar12 + local_384; local_2c0 = local_2c0 + 1) {
    uVar1 = *(uint *)(lVar8 + (long)(iVar4 + -1 + local_2c0 * iVar2 + iVar12) * 4);
    auVar10 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
    auVar10 = vinsertps_avx(auVar10,ZEXT416(uVar1),0x20);
    auVar10 = vinsertps_avx(auVar10,ZEXT416(uVar1),0x30);
    auVar11 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
    auVar11 = vinsertps_avx(auVar11,ZEXT416(uVar1),0x20);
    auVar11 = vinsertps_avx(auVar11,ZEXT416(uVar1),0x30);
    local_c0 = auVar11._0_4_;
    uStack_bc = auVar11._4_4_;
    uStack_b8 = auVar11._8_4_;
    uStack_b4 = auVar11._12_4_;
    uStack_b0 = auVar10._0_4_;
    uStack_ac = auVar10._4_4_;
    uStack_a8 = auVar10._8_4_;
    uStack_a4 = auVar10._12_4_;
    for (local_304 = iVar4 + iVar12; local_304 < iVar2 + -7; local_304 = local_304 + 8) {
      puVar14 = (undefined4 *)(lVar8 + (long)(local_2c0 * iVar2) * 4 + (long)local_304 * 4);
      *puVar14 = local_c0;
      puVar14[1] = uStack_bc;
      puVar14[2] = uStack_b8;
      puVar14[3] = uStack_b4;
      puVar14[4] = uStack_b0;
      puVar14[5] = uStack_ac;
      puVar14[6] = uStack_a8;
      puVar14[7] = uStack_a4;
    }
    for (; local_304 < iVar2; local_304 = local_304 + 1) {
      *(uint *)(lVar8 + (long)(local_2c0 * iVar2 + local_304) * 4) = uVar1;
    }
  }
  for (local_308 = iVar12 + local_384; local_30c = iVar12, local_308 < iVar3;
      local_308 = local_308 + 1) {
    for (; local_30c < iVar4 + iVar12 + -7; local_30c = local_30c + 8) {
      puVar15 = (undefined8 *)(lVar8 + (long)((local_308 + -1) * iVar2) * 4 + (long)local_30c * 4);
      puVar14 = (undefined4 *)(lVar8 + (long)(local_308 * iVar2) * 4 + (long)local_30c * 4);
      local_1c0 = (undefined4)*puVar15;
      uStack_1bc = (undefined4)((ulong)*puVar15 >> 0x20);
      uStack_1b8 = (undefined4)puVar15[1];
      uStack_1b4 = (undefined4)((ulong)puVar15[1] >> 0x20);
      uStack_1b0 = (undefined4)puVar15[2];
      uStack_1ac = (undefined4)((ulong)puVar15[2] >> 0x20);
      uStack_1a8 = (undefined4)puVar15[3];
      uStack_1a4 = (undefined4)((ulong)puVar15[3] >> 0x20);
      *puVar14 = local_1c0;
      puVar14[1] = uStack_1bc;
      puVar14[2] = uStack_1b8;
      puVar14[3] = uStack_1b4;
      puVar14[4] = uStack_1b0;
      puVar14[5] = uStack_1ac;
      puVar14[6] = uStack_1a8;
      puVar14[7] = uStack_1a4;
    }
    for (; local_30c < iVar4 + iVar12; local_30c = local_30c + 1) {
      *(undefined4 *)(lVar8 + (long)(local_308 * iVar2 + local_30c) * 4) =
           *(undefined4 *)(lVar8 + (long)((local_308 + -1) * iVar2 + local_30c) * 4);
    }
  }
  uVar1 = *(uint *)(lVar8 + (long)(iVar4 + -1 + (iVar12 + -1 + local_384) * iVar2 + iVar12) * 4);
  auVar10 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(uVar1),0x20);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(uVar1),0x30);
  auVar11 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar11 = vinsertps_avx(auVar11,ZEXT416(uVar1),0x20);
  auVar11 = vinsertps_avx(auVar11,ZEXT416(uVar1),0x30);
  local_80 = auVar11._0_8_;
  uStack_78 = auVar11._8_8_;
  uStack_70 = auVar10._0_8_;
  uStack_68 = auVar10._8_8_;
  for (local_384 = iVar12 + local_384; local_384 < iVar3; local_384 = local_384 + 1) {
    for (local_388 = iVar12 + iVar4; local_388 < iVar2 + -7; local_388 = local_388 + 8) {
      puVar15 = (undefined8 *)(lVar8 + (long)(local_384 * iVar2) * 4 + (long)local_388 * 4);
      *puVar15 = local_80;
      puVar15[1] = uStack_78;
      puVar15[2] = uStack_70;
      puVar15[3] = uStack_68;
    }
    for (; local_388 < iVar2; local_388 = local_388 + 1) {
      *(uint *)(lVar8 + (long)(local_384 * iVar2 + local_388) * 4) = uVar1;
    }
  }
  return;
}

Assistant:

void compute_padded_integral_img_faster_alg(float *gray_image, struct integral_image * iimage) {
    
    float *iimage_padded_data = iimage->padded_data;

    int data_width = iimage->data_width;
    int data_height = iimage->data_height;
    int width = iimage->width;
    int height = iimage->height;

    int border = (data_width - width) / 2; 
    //int border = PADDING_SIZE;

    // Block layout of padded integral image:
    // AAA
    // BIC
    // BDE

    __m256 zeros_float = _mm256_setzero_ps();

    // BLOCK A
    for (int j = 0; j < border; ++j) {
        int i = 0;
        for (; i < data_width - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, zeros_float);
        }
        for (; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = 0.0f;
        }
    }

    // BLOCK B
    for (int j = border; j < data_height; ++j) {
        int i = 0;
        for (; i < border - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, zeros_float);
        }
        for (; i < border; ++i) {
            iimage_padded_data[j * data_width + i] = 0.0f;
        }
    }

    // BLOCK I
    {
        float sum = 0.0f;
        float sum1 = 0.0f;
        
        int data_width = iimage->data_width;
        int width = iimage->width;
        int width_limit = width - 2;
        int height_limit = iimage->height - 2;
        float *iimage_data = iimage->data;

        int i = 0;
        // first row extra, since we don't have 0 padding
        for (i = 0; i < width_limit; i += 2) {
            sum += gray_image[i];
            iimage_data[i] = sum;
            sum += gray_image[i + 1];
            iimage_data[i + 1] = sum;

            sum1 += gray_image[width + i];
            iimage_data[data_width + i] = iimage_data[i] + sum1;
            sum1 += gray_image[width + i + 1];
            iimage_data[data_width + i + 1] = iimage_data[i + 1] + sum1;
        }

        // Handle last element of an image with odd width extra.
        // If previous stride = 2, then there should only be one element covered in this loop.
        // This might change if we increase the stride.
        for (; i < width; ++i) {
            sum += gray_image[i];
            iimage_data[i] = sum;
            // printf("row 0, col %i sum: %f\n", i, sum);
            sum1 += gray_image[width + i];
            // printf("row 1, col %i sum: %f\n", i, sum1);
            iimage_data[data_width + i] = iimage_data[i] + sum1;
        }

        // Handle all elements after the first row.
        i = 2;
        for (; i < height_limit; i += 2) {
            sum = 0.0f;
            sum1 = 0.0f;
            int j = 0;
            for (; j < width_limit; j += 2) {
                sum += gray_image[i * width + j];
                iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;
                sum += gray_image[i * width + j + 1];
                iimage_data[i * data_width + j + 1] = iimage_data[(i - 1) * data_width + j + 1] + sum;

                sum1 += gray_image[(i + 1) * width + j];
                iimage_data[(i + 1) * data_width + j] = iimage_data[i * data_width + j] + sum1;
                sum1 += gray_image[(i + 1) * width + j + 1];
                iimage_data[(i + 1) * data_width + j + 1] = iimage_data[i * data_width + j + 1] + sum1;
            }
            // printf("j: %i\n", j);

            // Handle last element of an image with odd width extra.
            // If previous stride = 2, then there should only be one element covered in this loop.
            // This might change if we increase the stride.
            for (; j < width; ++j) {
                // printf("j: %i; sum1: %f\n", j, sum1);
                sum += gray_image[i * width + j];
                iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;

                sum1 += gray_image[(i + 1) * width + j];
                // printf("sum1: %f\n", sum1);
                iimage_data[(i + 1) * data_width + j] = iimage_data[i * data_width + j] + sum1;
            }
        }

        // Handle last element of an image with odd height extra.
        // If previous stride = 2, then there should only be one row covered in this loop.
        // This might change if we increase the stride.
        for (; i < iimage->height ; ++i) {
            sum = 0.0f;
            int j = 0;
            for (; j < width_limit; j += 2) {
                // printf("j: %i; sum1: %f\n", j, sum);

                sum += gray_image[i * width + j];
                // printf("j: %i; sum1: %f\n", j, sum);
                iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;
                sum += gray_image[i * width + j + 1];
                // printf("j: %i; sum1: %f\n", j, sum);

                iimage_data[i * data_width + j + 1] = iimage_data[(i - 1) * data_width + j + 1] + sum;
            }
            // printf("j: %i\n", j);

            for (; j < width; ++j) {
                sum += gray_image[i * width + j];
                // printf("j: %i; sum1: %f\n", j, sum);

                iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;
            }
        }
    }

    // BLOCK C
    for (int j = border; j < border + height; ++j) {
        float last_element_in_row_float = iimage_padded_data[j * data_width + border + width - 1];
        __m256 last_element_in_row_vec = _mm256_set1_ps(last_element_in_row_float);
        int i = width + border;
        for (; i < data_width - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, last_element_in_row_vec);
        }
        for (; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = last_element_in_row_float;
        }
    }

    // BLOCK D   
    for (int j = border + height; j < data_height; ++j) {
        int i = border;
        for (; i < width + border - 7; i+=8) {
            __m256 prev_elements_in_row = _mm256_loadu_ps(iimage_padded_data + (j-1) * data_width + i);
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, prev_elements_in_row);
        }
        for (; i < width + border; ++i) {
            iimage_padded_data[j * data_width + i] = iimage_padded_data[(j-1) * data_width + i];
        }
    }

    // BLOCK E
    int index_last_element = (border + height - 1) * data_width + border + width - 1;
    float max_value_float = iimage_padded_data[index_last_element];
    __m256 max_value_vec = _mm256_set1_ps(max_value_float);
    for (int j = border + height; j < data_height; ++j) {
        int i = border + width;
        for (; i < data_width - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, max_value_vec);
        }
        for (; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = max_value_float;
        }
    }
    
}